

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# least.cpp
# Opt level: O1

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::BindLeastGreatest<duckdb::LeastOp>
          (duckdb *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  optional_idx error_location;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> _Var1;
  char cVar2;
  reference pvVar3;
  ParameterNotResolvedException *this_00;
  reference pvVar4;
  BinderException *this_01;
  pointer pEVar5;
  size_type __n;
  code *__f;
  LogicalType arg_type;
  undefined2 local_e0;
  shared_ptr<duckdb::ExtraTypeInfo,_true> local_d8;
  string local_c8;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> local_90;
  Expression local_88 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_90._M_head_impl = (FunctionData *)this;
  pvVar3 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,0);
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*(pvVar3);
  duckdb::ExpressionBinder::GetExpressionReturnType((Expression *)&local_e0);
  if (8 < (ulong)((long)(arguments->
                        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                        ).
                        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(arguments->
                       super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                       ).
                       super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)) {
    __n = 1;
    do {
      pvVar3 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::operator[](arguments,__n);
      unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                (pvVar3);
      duckdb::ExpressionBinder::GetExpressionReturnType(local_88);
      cVar2 = duckdb::LogicalType::TryGetMaxLogicalType
                        (context,(LogicalType *)&local_e0,(LogicalType *)local_88,
                         (LogicalType *)&local_e0);
      if (cVar2 == '\0') {
        this_01 = (BinderException *)__cxa_allocate_exception(0x10);
        pvVar3 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                 ::operator[](arguments,__n);
        pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(pvVar3);
        error_location.index = *(idx_t *)(pEVar5 + 0x30);
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_c8,
                   "Cannot combine types of %s and %s - an explicit cast is required","");
        duckdb::LogicalType::ToString_abi_cxx11_();
        duckdb::LogicalType::ToString_abi_cxx11_();
        BinderException::BinderException<std::__cxx11::string,std::__cxx11::string>
                  (this_01,error_location,&local_c8,&local_50,&local_70);
        __cxa_throw(this_01,&BinderException::typeinfo,std::runtime_error::~runtime_error);
      }
      duckdb::LogicalType::~LogicalType((LogicalType *)local_88);
      __n = __n + 1;
    } while (__n < (ulong)((long)(arguments->
                                 super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                 ).
                                 super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(arguments->
                                 super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                 ).
                                 super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  if (local_e0._0_1_ == (Expression)0x25) {
    duckdb::LogicalType::LogicalType((LogicalType *)&local_c8,VARCHAR);
LAB_0067c185:
    local_e0 = local_c8._M_dataplus._M_p._0_2_;
    duckdb::LogicalType::~LogicalType((LogicalType *)&local_c8);
  }
  else {
    if (local_e0._0_1_ == (Expression)0x26) {
      duckdb::IntegerLiteral::GetType((LogicalType *)&local_c8);
      goto LAB_0067c185;
    }
    if (local_e0._0_1_ == (Expression)0x2) {
      this_00 = (ParameterNotResolvedException *)__cxa_allocate_exception(0x10);
      duckdb::ParameterNotResolvedException::ParameterNotResolvedException(this_00);
      __cxa_throw(this_00,&ParameterNotResolvedException::typeinfo,
                  std::runtime_error::~runtime_error);
    }
  }
  switch(local_e0._1_1_) {
  case (value_type)0x1:
  case (value_type)0x3:
    __f = LeastGreatestFunction<signed_char,duckdb::LessThan,duckdb::StandardLeastGreatest<false>>;
    break;
  case (value_type)0x2:
  case (value_type)0x4:
  case (value_type)0x6:
  case (value_type)0x8:
  case (value_type)0xa:
  case (value_type)0xb:
switchD_0067c1fd_caseD_2:
    std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::operator=
              ((function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)> *)
               &bound_function->function,
               LeastGreatestFunction<duckdb::string_t,duckdb::LessThan,duckdb::SortKeyLeastGreatest>
              );
    bound_function->init_local_state = LeastGreatestSortKeyInit<duckdb::LeastOp>;
    goto LAB_0067c2a6;
  case (value_type)0x5:
    __f = LeastGreatestFunction<short,duckdb::LessThan,duckdb::StandardLeastGreatest<false>>;
    break;
  case (value_type)0x7:
    __f = LeastGreatestFunction<int,duckdb::LessThan,duckdb::StandardLeastGreatest<false>>;
    break;
  case (value_type)0x9:
    __f = LeastGreatestFunction<long,duckdb::LessThan,duckdb::StandardLeastGreatest<false>>;
    break;
  case (value_type)0xc:
    __f = LeastGreatestFunction<double,duckdb::LessThan,duckdb::StandardLeastGreatest<false>>;
    break;
  default:
    if (local_e0._1_1_ == (value_type)0xc8) {
      __f = 
      LeastGreatestFunction<duckdb::string_t,duckdb::LessThan,duckdb::StandardLeastGreatest<true>>;
    }
    else {
      if (local_e0._1_1_ != (value_type)0xcc) goto switchD_0067c1fd_caseD_2;
      __f = 
      LeastGreatestFunction<duckdb::hugeint_t,duckdb::LessThan,duckdb::StandardLeastGreatest<false>>
      ;
    }
  }
  std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::operator=
            ((function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)> *)
             &bound_function->function,__f);
LAB_0067c2a6:
  pvVar4 = vector<duckdb::LogicalType,_true>::operator[]
                     ((vector<duckdb::LogicalType,_true> *)&bound_function->field_0x48,0);
  if (pvVar4 != (reference)&local_e0) {
    *pvVar4 = (value_type)local_e0._0_1_;
    pvVar4[1] = local_e0._1_1_;
    shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
              ((shared_ptr<duckdb::ExtraTypeInfo,_true> *)(pvVar4 + 8),&local_d8);
  }
  if ((reference)&bound_function->field_0x78 != (reference)&local_e0) {
    bound_function->field_0x78 = local_e0._0_1_;
    bound_function->field_0x79 = local_e0._1_1_;
    shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
              ((shared_ptr<duckdb::ExtraTypeInfo,_true> *)&bound_function->field_0x80,&local_d8);
  }
  if ((reference)&bound_function->field_0x90 != (reference)&local_e0) {
    bound_function->field_0x90 = local_e0._0_1_;
    bound_function->field_0x91 = local_e0._1_1_;
    shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
              ((shared_ptr<duckdb::ExtraTypeInfo,_true> *)&bound_function->field_0x98,&local_d8);
  }
  _Var1._M_head_impl = local_90._M_head_impl;
  *(undefined8 *)local_90._M_head_impl = 0;
  duckdb::LogicalType::~LogicalType((LogicalType *)&local_e0);
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (_Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>)
         _Var1._M_head_impl;
}

Assistant:

unique_ptr<FunctionData> BindLeastGreatest(ClientContext &context, ScalarFunction &bound_function,
                                           vector<unique_ptr<Expression>> &arguments) {
	LogicalType child_type = ExpressionBinder::GetExpressionReturnType(*arguments[0]);
	for (idx_t i = 1; i < arguments.size(); i++) {
		auto arg_type = ExpressionBinder::GetExpressionReturnType(*arguments[i]);
		if (!LogicalType::TryGetMaxLogicalType(context, child_type, arg_type, child_type)) {
			throw BinderException(arguments[i]->GetQueryLocation(),
			                      "Cannot combine types of %s and %s - an explicit cast is required",
			                      child_type.ToString(), arg_type.ToString());
		}
	}
	switch (child_type.id()) {
	case LogicalTypeId::UNKNOWN:
		throw ParameterNotResolvedException();
	case LogicalTypeId::INTEGER_LITERAL:
		child_type = IntegerLiteral::GetType(child_type);
		break;
	case LogicalTypeId::STRING_LITERAL:
		child_type = LogicalType::VARCHAR;
		break;
	default:
		break;
	}
	using OP = typename LEAST_GREATER_OP::OP;
	switch (child_type.InternalType()) {
#ifndef DUCKDB_SMALLER_BINARY
	case PhysicalType::BOOL:
	case PhysicalType::INT8:
		bound_function.function = LeastGreatestFunction<int8_t, OP>;
		break;
	case PhysicalType::INT16:
		bound_function.function = LeastGreatestFunction<int16_t, OP>;
		break;
	case PhysicalType::INT32:
		bound_function.function = LeastGreatestFunction<int32_t, OP>;
		break;
	case PhysicalType::INT64:
		bound_function.function = LeastGreatestFunction<int64_t, OP>;
		break;
	case PhysicalType::INT128:
		bound_function.function = LeastGreatestFunction<hugeint_t, OP>;
		break;
	case PhysicalType::DOUBLE:
		bound_function.function = LeastGreatestFunction<double, OP>;
		break;
	case PhysicalType::VARCHAR:
		bound_function.function = LeastGreatestFunction<string_t, OP, StandardLeastGreatest<true>>;
		break;
#endif
	default:
		// fallback with sort keys
		bound_function.function = LeastGreatestFunction<string_t, OP, SortKeyLeastGreatest>;
		bound_function.init_local_state = LeastGreatestSortKeyInit<LEAST_GREATER_OP>;
		break;
	}
	bound_function.arguments[0] = child_type;
	bound_function.varargs = child_type;
	bound_function.return_type = child_type;
	return nullptr;
}